

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom parse_ident(JSParseState *s,uint8_t **pp,BOOL *pident_has_escape,int c,BOOL is_private)

{
  int iVar1;
  JSAtom JVar2;
  uint in_ECX;
  byte *pbVar3;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  int in_R8D;
  JSAtom atom;
  size_t ident_pos;
  size_t ident_size;
  char *buf;
  char ident_buf [128];
  uint8_t *p1;
  uint8_t *p;
  undefined4 in_stack_ffffffffffffff28;
  JSContext *ctx;
  char *static_buf;
  size_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  JSContext *in_stack_ffffffffffffff58;
  byte *local_30;
  byte *local_28;
  uint local_1c;
  undefined4 *local_18;
  undefined8 *local_10;
  
  local_28 = (byte *)*in_RSI;
  static_buf = &stack0xffffffffffffff48;
  ctx = (JSContext *)(ulong)(in_R8D != 0);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    local_30 = local_28;
    if ((int)local_1c < 0x80) {
      static_buf[(long)ctx] = (char)local_1c;
      ctx = (JSContext *)((long)&(ctx->header).ref_count + 1);
    }
    else {
      iVar1 = unicode_to_utf8((uint8_t *)(static_buf + (long)ctx),local_1c);
      ctx = (JSContext *)((long)&(ctx->header).ref_count + (long)iVar1);
    }
    pbVar3 = local_30 + 1;
    local_1c = (uint)*local_30;
    local_30 = pbVar3;
    if ((local_1c == 0x5c) && (*pbVar3 == 0x75)) {
      local_1c = lre_parse_escape((uint8_t **)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      *local_18 = 1;
    }
    else if (0x7f < local_1c) {
      local_1c = unicode_from_utf8(local_28,6,&local_30);
    }
    iVar1 = lre_js_is_ident_next((int)ctx);
    if (iVar1 == 0) break;
    local_28 = local_30;
    if (((JSContext *)0x79 < ctx) &&
       (iVar1 = ident_realloc(in_stack_ffffffffffffff58,
                              (char **)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                              ,in_stack_ffffffffffffff48,static_buf), iVar1 != 0)) {
      JVar2 = 0;
LAB_0018cc95:
      if (static_buf != &stack0xffffffffffffff48) {
        js_free(ctx,(void *)CONCAT44(JVar2,in_stack_ffffffffffffff28));
      }
      *local_10 = local_28;
      return JVar2;
    }
  }
  JVar2 = JS_NewAtomLen(in_stack_ffffffffffffff58,
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (size_t)in_stack_ffffffffffffff48);
  goto LAB_0018cc95;
}

Assistant:

static JSAtom parse_ident(JSParseState *s, const uint8_t **pp,
                          BOOL *pident_has_escape, int c, BOOL is_private)
{
    const uint8_t *p, *p1;
    char ident_buf[128], *buf;
    size_t ident_size, ident_pos;
    JSAtom atom;
    
    p = *pp;
    buf = ident_buf;
    ident_size = sizeof(ident_buf);
    ident_pos = 0;
    if (is_private)
        buf[ident_pos++] = '#';
    for(;;) {
        p1 = p;
        
        if (c < 128) {
            buf[ident_pos++] = c;
        } else {
            ident_pos += unicode_to_utf8((uint8_t*)buf + ident_pos, c);
        }
        c = *p1++;
        if (c == '\\' && *p1 == 'u') {
            c = lre_parse_escape(&p1, TRUE);
            *pident_has_escape = TRUE;
        } else if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p1);
        }
        if (!lre_js_is_ident_next(c))
            break;
        p = p1;
        if (unlikely(ident_pos >= ident_size - UTF8_CHAR_LEN_MAX)) {
            if (ident_realloc(s->ctx, &buf, &ident_size, ident_buf)) {
                atom = JS_ATOM_NULL;
                goto done;
            }
        }
    }
    atom = JS_NewAtomLen(s->ctx, buf, ident_pos);
 done:
    if (unlikely(buf != ident_buf))
        js_free(s->ctx, buf);
    *pp = p;
    return atom;
}